

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_queue.h
# Opt level: O2

bool __thiscall
webrtc::
SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>::
Insert(SwapQueue<std::vector<short,_std::allocator<short>_>,_webrtc::RenderQueueItemVerifier<short>_>
       *this,vector<short,_std::allocator<short>_> *input)

{
  size_t sVar1;
  pointer pvVar2;
  size_t sVar3;
  string *psVar4;
  ostream *poVar5;
  size_t sVar6;
  size_t sVar7;
  CritScope cs;
  FatalMessage local_1a8;
  
  if (input == (vector<short,_std::allocator<short>_> *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
               ,0x79);
    poVar5 = std::operator<<((ostream *)&local_1a8,"Check failed: input");
    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<(poVar5,"# ");
  }
  else {
    rtc::CritScope::CritScope(&cs,&this->crit_queue_);
    if ((ulong)((long)(input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
                (long)(input->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 1) <
        (this->queue_item_verifier_).minimum_capacity_) {
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                 ,0x7d);
      poVar5 = std::operator<<((ostream *)&local_1a8,"Check failed: queue_item_verifier_(*input)");
      poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
      std::operator<<(poVar5,"# ");
    }
    else {
      sVar1 = this->num_elements_;
      pvVar2 = (this->queue_).
               super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar3 = ((long)(this->queue_).
                     super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
      if (sVar1 == sVar3) {
LAB_0017f4cf:
        rtc::CritScope::~CritScope(&cs);
        return sVar1 != sVar3;
      }
      std::_Vector_base<short,_std::allocator<short>_>::_Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)input,(_Vector_impl_data *)(pvVar2 + this->next_write_index_))
      ;
      sVar6 = this->next_write_index_ + 1;
      local_1a8._0_8_ =
           ((long)(this->queue_).
                  super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->queue_).
                 super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      sVar7 = 0;
      if (sVar6 != local_1a8._0_8_) {
        sVar7 = sVar6;
      }
      this->next_write_index_ = sVar7;
      this->num_elements_ = this->num_elements_ + 1;
      psVar4 = rtc::CheckLTImpl<unsigned_long,unsigned_long>
                         (&this->next_write_index_,(unsigned_long *)&local_1a8,
                          "next_write_index_ < queue_.size()");
      if (psVar4 == (string *)0x0) {
        local_1a8._0_8_ =
             ((long)(this->queue_).
                    super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->queue_).
                   super__Vector_base<std::vector<short,_std::allocator<short>_>,_std::allocator<std::vector<short,_std::allocator<short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        psVar4 = rtc::CheckLEImpl<unsigned_long,unsigned_long>
                           (&this->num_elements_,(unsigned_long *)&local_1a8,
                            "num_elements_ <= queue_.size()");
        if (psVar4 == (string *)0x0) goto LAB_0017f4cf;
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8e,psVar4);
      }
      else {
        rtc::FatalMessage::FatalMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/swap_queue.h"
                   ,0x8d,psVar4);
      }
    }
  }
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

bool Insert(T* input) WARN_UNUSED_RESULT {
    RTC_DCHECK(input);

    rtc::CritScope cs(&crit_queue_);

    RTC_DCHECK(queue_item_verifier_(*input));

    if (num_elements_ == queue_.size()) {
      return false;
    }

    using std::swap;
    swap(*input, queue_[next_write_index_]);

    ++next_write_index_;
    if (next_write_index_ == queue_.size()) {
      next_write_index_ = 0;
    }

    ++num_elements_;

    RTC_DCHECK_LT(next_write_index_, queue_.size());
    RTC_DCHECK_LE(num_elements_, queue_.size());

    return true;
  }